

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmInstructionType
anon_unknown.dwarf_22bf96::GetLoadInstruction(ExpressionContext *ctx,TypeBase *type)

{
  uint uVar1;
  ulong uVar2;
  VmInstructionType VVar3;
  
  if (ctx->typeBool == type) {
    return VM_INST_LOAD_BYTE;
  }
  if (ctx->typeChar == type) {
    return VM_INST_LOAD_BYTE;
  }
  if (ctx->typeShort == type) {
    return VM_INST_LOAD_SHORT;
  }
  if (ctx->typeInt == type) {
LAB_0027b70f:
    VVar3 = VM_INST_LOAD_INT;
  }
  else {
    if (ctx->typeFloat == type) {
      return VM_INST_LOAD_FLOAT;
    }
    if (ctx->typeDouble == type) {
      return VM_INST_LOAD_DOUBLE;
    }
    if (ctx->typeLong == type) {
      return VM_INST_LOAD_LONG;
    }
    if (type == (TypeBase *)0x0) {
      if (ctx->typeAutoRef == (TypeStruct *)0x0) {
        return VM_INST_LOAD_STRUCT;
      }
      if (ctx->typeAutoArray == (TypeStruct *)0x0) {
        return VM_INST_LOAD_STRUCT;
      }
    }
    else {
      uVar1 = type->typeID;
      if (uVar1 == 0x12) {
        return VM_INST_LOAD_LONG;
      }
      if (uVar1 == 0x15) {
        return VM_INST_LOAD_STRUCT;
      }
      if (uVar1 == 0x14) {
        return VM_INST_LOAD_STRUCT;
      }
      if (ctx->typeAutoRef == (TypeStruct *)type) {
        return VM_INST_LOAD_STRUCT;
      }
      if (ctx->typeAutoArray == (TypeStruct *)type) {
        return VM_INST_LOAD_STRUCT;
      }
      if (uVar1 - 9 < 2) goto LAB_0027b70f;
      if (uVar1 == 0xb) {
        return VM_INST_LOAD_LONG;
      }
      if (uVar1 == 0x19) {
        return VM_INST_LOAD_INT;
      }
    }
    uVar2 = type->size;
    if (uVar2 == 0) {
      __assert_fail("type->size != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,400,
                    "VmInstructionType (anonymous namespace)::GetLoadInstruction(ExpressionContext &, TypeBase *)"
                   );
    }
    if ((uVar2 & 3) != 0) {
      __assert_fail("type->size % 4 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x191,
                    "VmInstructionType (anonymous namespace)::GetLoadInstruction(ExpressionContext &, TypeBase *)"
                   );
    }
    VVar3 = VM_INST_LOAD_STRUCT;
    if (0xfffffff < (long)uVar2) {
      __assert_fail("type->size < NULLC_MAX_TYPE_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x192,
                    "VmInstructionType (anonymous namespace)::GetLoadInstruction(ExpressionContext &, TypeBase *)"
                   );
    }
  }
  return VVar3;
}

Assistant:

VmInstructionType GetLoadInstruction(ExpressionContext &ctx, TypeBase *type)
	{
		if(type == ctx.typeBool || type == ctx.typeChar)
			return VM_INST_LOAD_BYTE;

		if(type == ctx.typeShort)
			return VM_INST_LOAD_SHORT;

		if(type == ctx.typeInt)
			return VM_INST_LOAD_INT;

		if(type == ctx.typeFloat)
			return VM_INST_LOAD_FLOAT;

		if(type == ctx.typeDouble)
			return VM_INST_LOAD_DOUBLE;

		if(type == ctx.typeLong)
			return VM_INST_LOAD_LONG;

		if(isType<TypeRef>(type))
			return VM_INST_LOAD_POINTER;

		if(isType<TypeFunction>(type))
			return VM_INST_LOAD_STRUCT;

		if(isType<TypeUnsizedArray>(type))
			return VM_INST_LOAD_STRUCT;

		if(type == ctx.typeAutoRef)
			return VM_INST_LOAD_STRUCT;

		if(type == ctx.typeAutoArray)
			return VM_INST_LOAD_STRUCT;

		if(isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeEnum>(type))
			return VM_INST_LOAD_INT;

		if(isType<TypeNullptr>(type))
			return VM_INST_LOAD_POINTER;

		assert(type->size != 0);
		assert(type->size % 4 == 0);
		assert(type->size < NULLC_MAX_TYPE_SIZE);

		return VM_INST_LOAD_STRUCT;
	}